

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O1

double __thiscall
ON_SubDSectorType::GetSubdominantEigenvectors
          (ON_SubDSectorType *this,double *E1,size_t E1_capacity,double *E2,size_t E2_capacity)

{
  ON_SubDVertexTag OVar1;
  uint uVar2;
  uint n;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double cos1;
  double sin1;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  dVar6 = SubdominantEigenvalue(this);
  if ((((0.0 < dVar6) && (dVar6 < 1.0)) &&
      (local_40 = dVar6, uVar2 = PointRingCount(this), 2 < uVar2)) && (n = FaceCount(this), n != 0))
  {
    if (E1_capacity == 0) {
      E1 = (double *)0x0;
    }
    else if (E1 == (double *)0x0 || E1_capacity < uVar2) goto switchD_0062c537_default;
    if (E2_capacity == 0) {
      E2 = (double *)0x0;
    }
    else if (E2 == (double *)0x0 || E2_capacity < uVar2) goto switchD_0062c537_default;
    if ((E1 != (double *)0x0 && E2 != (double *)0x0) || (E1 == (double *)0x0 && E2 == (double *)0x0)
       ) {
      OVar1 = VertexTag(this);
      switch(OVar1) {
      case Smooth:
        if ((uVar2 & 1) != 0) {
          if (E1 == (double *)0x0) {
            return local_40;
          }
          ON_SubDMatrix::EvaluateCosAndSin(2,n,&local_60,&local_58);
          if ((local_40 != 0.25) || (NAN(local_40))) {
            dVar6 = local_40 * 4.0 + -1.0;
            local_38 = (dVar6 + dVar6) / (local_60 + 1.0) + -1.0;
          }
          else {
            local_38 = -1.0;
          }
          *E1 = 0.0;
          *E2 = 0.0;
          E1[1] = 0.0;
          E2[1] = 1.0;
          E1[2] = (local_58 + 0.0) * local_38;
          E2[2] = (local_60 + 1.0) * local_38;
          if (uVar2 == 3) {
            return local_40;
          }
          uVar5 = 3;
          do {
            local_50 = local_58;
            local_48 = local_60;
            E1[uVar5] = local_58;
            E2[uVar5] = local_60;
            uVar4 = (int)uVar5 + 1;
            ON_SubDMatrix::EvaluateCosAndSin(uVar4,n,&local_60,&local_58);
            E1[uVar4] = (local_50 + local_58) * local_38;
            E2[uVar4] = (local_48 + local_60) * local_38;
            uVar4 = (int)uVar5 + 2;
            uVar5 = (ulong)uVar4;
          } while (uVar2 != uVar4);
          return local_40;
        }
        break;
      case Crease:
        if ((uVar2 & 1) == 0) {
          if (n == 1) {
            *E1 = 0.0;
            E1[1] = 1.0;
            E1[2] = 0.0;
            E1[3] = -1.0;
            *E2 = 1.0;
            E2[1] = -2.0;
            E2[2] = -5.0;
            E2[3] = -2.0;
            return local_40;
          }
          local_60 = 1.0;
          local_58 = 0.0;
          *E1 = 0.0;
          *E2 = 0.0;
          uVar4 = 2;
          do {
            uVar3 = uVar4 - 1;
            local_48 = local_60;
            local_50 = local_58;
            ON_SubDMatrix::EvaluateCosAndSin((uVar3 >> 1) + 1,n,&local_60,&local_58);
            E1[uVar3] = local_50;
            E2[uVar3] = local_48;
            E1[uVar4] = local_50 + local_58;
            E2[uVar4] = local_48 + local_60;
            uVar4 = uVar4 + 2;
          } while (uVar2 != uVar4);
LAB_0062c871:
          E1[uVar4 - 1] = local_58;
          E2[uVar4 - 1] = local_60;
          return local_40;
        }
        break;
      case Corner:
        if ((uVar2 & 1) == 0) {
          uVar3 = CornerSectorAngleIndex(this);
          uVar4 = 0x48 - uVar3;
          if (uVar3 * 2 < 0x49) {
            uVar4 = uVar3;
          }
          local_38 = (double)CONCAT44(local_38._4_4_,uVar4 * 2);
          local_60 = 1.0;
          local_58 = 0.0;
          *E1 = 0.0;
          *E2 = 0.0;
          uVar4 = 2;
          do {
            uVar3 = uVar4 - 1;
            local_48 = local_60;
            local_50 = local_58;
            ON_SubDMatrix::EvaluateCosAndSin
                      (((uVar3 >> 1) + 1) * local_38._0_4_,n * 0x48,&local_60,&local_58);
            E1[uVar3] = local_50;
            E2[uVar3] = local_48;
            E1[uVar4] = local_50 + local_58;
            E2[uVar4] = local_48 + local_60;
            uVar4 = uVar4 + 2;
          } while (uVar2 != uVar4);
          goto LAB_0062c871;
        }
        break;
      case Dart:
        if ((uVar2 & 1) != 0) {
          if (E1 == (double *)0x0) {
            return local_40;
          }
          ON_SubDMatrix::EvaluateCosAndSin(2,n,&local_60,&local_58);
          *E1 = 0.0;
          *E2 = 0.0;
          E1[1] = 0.0;
          E2[1] = 1.0;
          E1[2] = local_58 + 0.0;
          E2[2] = local_60 + 1.0;
          if (uVar2 == 3) {
            return local_40;
          }
          uVar5 = 3;
          do {
            local_50 = local_58;
            local_48 = local_60;
            E1[uVar5] = local_58;
            E2[uVar5] = local_60;
            uVar4 = (int)uVar5 + 1;
            ON_SubDMatrix::EvaluateCosAndSin(uVar4,n,&local_60,&local_58);
            E1[uVar4] = local_50 + local_58;
            E2[uVar4] = local_48 + local_60;
            uVar4 = (int)uVar5 + 2;
            uVar5 = (ulong)uVar4;
          } while (uVar2 != uVar4);
          return local_40;
        }
      }
    }
  }
switchD_0062c537_default:
  ON_SubDIncrementErrorCount();
  return -1.23432101234321e+308;
}

Assistant:

double ON_SubDSectorType::GetSubdominantEigenvectors(
  double* E1,
  size_t E1_capacity,
  double* E2,
  size_t E2_capacity
) const
{
  const double rc_error = ON_UNSET_VALUE;
  const double lambda = SubdominantEigenvalue();
  if (!(lambda > 0.0 && lambda < 1.0))
    return ON_SUBD_RETURN_ERROR(rc_error);

  const unsigned int R = PointRingCount();
  if (R < 3)
    return ON_SUBD_RETURN_ERROR(rc_error);

  const unsigned int F = FaceCount();
  if (F < 1)
    return ON_SUBD_RETURN_ERROR(rc_error);

  if ( 0 == E1_capacity)
    E1 = nullptr;
  else if (E1_capacity < R || nullptr == E1)
  {
    return ON_SUBD_RETURN_ERROR(rc_error);
  }

  if ( 0 == E2_capacity)
    E2 = nullptr;
  else if (E2_capacity < R || nullptr == E2)
  {
    return ON_SUBD_RETURN_ERROR(rc_error);
  }

  if (nullptr == E1 || nullptr == E2)
  {
    // If one of LT0ev or E2 is null, then both must be null.
    if (nullptr != E1 || nullptr != E2)
    {
      return ON_SUBD_RETURN_ERROR(rc_error);
    }
  }

  double y, cos0, cos1, sin0, sin1;

  switch (VertexTag())
  {
  case ON_SubDVertexTag::Unset:
    break;

  case ON_SubDVertexTag::Smooth:
    if (1 == (R % 2))
    {
      if (nullptr != E1)
      {
        // cos0 = cos(2pi * 0/F)
        // sin0 = sin(2pi * 0/F)
        // cos1 = cos(2pi * 1/F)
        // sin1 = sin(2pi * 1/F)
        cos0 = 1.0;
        sin0 = 0.0;
        ON_SubDMatrix::EvaluateCosAndSin(2, F, &cos1, &sin1);
        //y = 0.5*(3.0 * sqrt((1.0 + cos1 / 9.0) / (1.0 + cos1)) - 1.0);
        y = (0.25 == lambda) ? -1.0 : (2.0*(4.0*lambda - 1.0) / (1.0 + cos1) - 1.0);
        E1[0] = 0.0;
        E2[0] = 0.0;
        E1[1] = sin0;
        E2[1] = cos0;
        unsigned int i = 2;
        for (;;)
        {
          E1[i] = y*(sin0 + sin1);
          E2[i] = y*(cos0 + cos1);
          i++;
          if (i==R)
            break;
          E1[i] = sin1;
          E2[i] = cos1;
          i++;
          cos0 = cos1;
          sin0 = sin1;
          ON_SubDMatrix::EvaluateCosAndSin(i, F, &cos1, &sin1);
          // E1[] and E2[] values are symmetric and we could stop halfway and copy
          // current loop debugged and tested Feb 10, 2015
        }
      }
      return lambda;
    }
    break;

  case ON_SubDVertexTag::Dart:
    if (1 == (R % 2))
    {
      if (nullptr != E1)
      {
        // cos0 = cos(2pi * 0/F)
        // sin0 = sin(2pi * 0/F)
        // cos1 = cos(2pi * 1/F)
        // sin1 = sin(2pi * 1/F)
        cos0 = 1.0;
        sin0 = 0.0;
        ON_SubDMatrix::EvaluateCosAndSin(2, F, &cos1, &sin1);
        E1[0] = 0.0;
        E2[0] = 0.0;
        E1[1] = sin0;
        E2[1] = cos0;
        unsigned int i = 2;
        for (;;)
        {
          E1[i] = sin0 + sin1;
          E2[i] = cos0 + cos1;
          i++;
          if (i==R)
            break;
          E1[i] = sin1;
          E2[i] = cos1;
          i++;
          cos0 = cos1;
          sin0 = sin1;
          ON_SubDMatrix::EvaluateCosAndSin(i, F, &cos1, &sin1);
          // E1[] and E2[] values are symmetric and we could stop halfway and copy
          // current loop debugged and tested Feb 10, 2015
        }
      }
      return lambda;
    }
    break;

  case ON_SubDVertexTag::Corner:
    if (0 == (R % 2))
    {
      const unsigned int sector_angle_index = CornerSectorAngleIndex();
      const unsigned int M = ON_SubDSectorType::MaximumCornerAngleIndex;
      //const unsigned int I = ((2*sector_angle_index <= M) ? sector_angle_index : (M-sector_angle_index));
      const unsigned int I = 2*((2*sector_angle_index <= M) ? sector_angle_index : (M-sector_angle_index));
      // F faces, F-1 interior smooth edges and 2 boundary edges
      // theta = (i/M*2pi)/F
      cos1 = 1.0; // = cos(0)
      sin1 = 0.0; // = sin(0)
      E1[0] = 0.0;
      E2[0] = 0.0;
      unsigned int i = 1;
      for (;;)
      {
        cos0 = cos1;
        sin0 = sin1;
        ON_SubDMatrix::EvaluateCosAndSin((i/2 + 1)*I,F*M,&cos1,&sin1);
        E1[i] = sin0;
        E2[i] = cos0;
        i++;
        E1[i] = sin0+sin1;
        E2[i] = cos0+cos1;
        i++;
        if (R - 1 == i)
        {
          E1[i] = sin1; // = sin(pi)
          E2[i] = cos1; // = cos(pi)
          break;
        }
      }
      return lambda;
    }
    break;

  case ON_SubDVertexTag::Crease:
    if (0 == (R % 2))
    {
      if (1 == F)
      {
        // one face and 2 boundary edges
        // E1 = eigenvector with eigenvalue = 1/2
        E1[0] =  0.0; // center point coefficients
        E1[1] =  1.0; // initial boundary edge point coefficient
        E1[2] =  0.0; // face point coefficient
        E1[3] = -1.0; // final boundary edge point coefficient


        // (0,0,1,0) = eigenvector with eigenvalue = 1/4.
        // E2 is not an eigenvector
        // S * E2 = (1/4, 1/4, 2/5, 1/4)
        E2[0] =  1.0; // center point coefficients
        E2[1] = -2.0; // boundary edge point coefficient
        E2[2] = -5.0; // face point coefficient
        E2[3] = -2.0; // boundary edge point coefficient
      }
      else
      {
        // F faces, F-1 interior smooth edges and 2 boundary edges
        // theta = pi/F
        cos1 = 1.0; // = cos(0)
        sin1 = 0.0; // = sin(0)
        E1[0] = 0.0;
        E2[0] = 0.0;
        unsigned int i = 1;
        for (;;)
        {
          cos0 = cos1;
          sin0 = sin1;
          ON_SubDMatrix::EvaluateCosAndSin(i/2 + 1,F,&cos1,&sin1);
          E1[i] = sin0;
          E2[i] = cos0;
          i++;
          E1[i] = sin0+sin1;
          E2[i] = cos0+cos1;
          i++;
          if (R - 1 == i)
          {
            E1[i] = sin1; // = sin(pi)
            E2[i] = cos1; // = cos(pi)
            break;
          }
        }
      }

      return lambda;
    }
    break;
  }

  return ON_SUBD_RETURN_ERROR(rc_error);
}